

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O2

int Ucs2CopyDataProc(size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
                    Col_ClientData clientData)

{
  Col_StringFormat CVar1;
  undefined2 *puVar2;
  uint uVar3;
  uint *data;
  bool bVar4;
  
  data = (uint *)chunks->data;
  do {
    bVar4 = length == 0;
    length = length - 1;
    if (bVar4) {
      return 0;
    }
    CVar1 = chunks->format;
    if (CVar1 == COL_UTF16) {
      uVar3 = Col_Utf16Get((Col_Char2 *)data);
      goto LAB_001097a0;
    }
    if (CVar1 == COL_UCS2) {
      uVar3 = (uint)(ushort)*data;
LAB_001097af:
      puVar2 = *clientData;
      *puVar2 = (short)uVar3;
      *(undefined2 **)clientData = puVar2 + 1;
    }
    else {
      if (CVar1 == COL_UCS4) {
        uVar3 = *data;
LAB_001097a0:
        if (uVar3 < 0x10000) goto LAB_001097af;
      }
      else {
        if (CVar1 == COL_UTF8) {
          uVar3 = Col_Utf8Get((Col_Char1 *)data);
          goto LAB_001097a0;
        }
        if (CVar1 == COL_UCS1) {
          uVar3 = (uint)(byte)*data;
          goto LAB_001097af;
        }
      }
      uVar3 = *(uint *)((long)clientData + 8);
      if (uVar3 != 0xffffffff) goto LAB_001097af;
    }
    CVar1 = chunks->format;
    if (CVar1 == COL_UCS1) {
      data = (uint *)((long)data + 1);
    }
    else if (CVar1 == COL_UCS2) {
      data = (uint *)((long)data + 2);
    }
    else if (CVar1 == COL_UCS4) {
      data = data + 1;
    }
    else if (CVar1 == COL_UTF8) {
      data = (uint *)Col_Utf8Next((Col_Char1 *)data);
    }
    else if (CVar1 == COL_UTF16) {
      data = (uint *)Col_Utf16Next((Col_Char2 *)data);
    }
    else {
      data = (uint *)0x0;
    }
  } while( true );
}

Assistant:

static int
Ucs2CopyDataProc(
    size_t index,                   /*!< Rope-relative index where chunks
                                         begin. */
    size_t length,                  /*!< Length of chunks. */
    size_t number,                  /*!< Number of chunks. Always 1. */
    const Col_RopeChunk *chunks,    /*!< Array of chunks. First chunk never
                                         NULL. */

    /*! [in,out] Points to #CopyDataInfo. */
    Col_ClientData clientData)
{
    CopyDataInfo *info = (CopyDataInfo *) clientData;
    const char *p = (const char *) chunks->data;
    Col_Char c;
    size_t i;

    ASSERT(number == 1);

    for (i = 0; i < length; i++, COL_CHAR_NEXT(chunks->format, p)) {
        c = COL_CHAR_GET(chunks->format, p);
        if (c > COL_CHAR2_MAX) {
            if (info->replace == COL_CHAR_INVALID) continue;
            c = info->replace;
        }
        *(Col_Char2 *) info->data = c;
        info->data += CHAR_WIDTH(COL_UCS2);
    }
    return 0;
}